

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall IR::IRBuilder::move(IRBuilder *this,Temp *target,Temp *source)

{
  BasicBlock *this_00;
  bool bVar1;
  reference local_28;
  Temp *local_20;
  Temp *source_local;
  Temp *target_local;
  IRBuilder *this_local;
  
  local_20 = source;
  source_local = target;
  target_local = (Temp *)this;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::Move,std::allocator<IR::Move>>::
    emplace_front<IR::Temp_const*&,IR::Temp_const*&>
              ((forward_list<IR::Move,std::allocator<IR::Move>> *)&this->function_->moves_,
               &source_local,&local_20);
    this_00 = this->block_;
    local_28 = std::forward_list<IR::Move,_std::allocator<IR::Move>_>::front
                         (&this->function_->moves_);
    std::vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>::push_back
              (&this_00->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>,
               (value_type *)&local_28);
  }
  return;
}

Assistant:

void IRBuilder::move(const Temp* target, const Temp* source) {
  if (block_->isTerminated()) return;
  function_->moves_.emplace_front(target, source);
  block_->push_back(&function_->moves_.front());
}